

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

int __thiscall glcts::LayoutBindingTests::init(LayoutBindingTests *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar11;
  undefined **ppuVar12;
  StageType *pSVar13;
  pointer pLVar14;
  pointer testArgs;
  undefined1 *this_00;
  pointer stageType;
  StageType stage;
  StageType stage_00;
  StageType stage_01;
  StageType stage_02;
  StageType stage_03;
  String testName;
  vector<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_> samplers;
  vector<glcts::StageType,_std::allocator<glcts::StageType>_> stages;
  
  std::vector<glcts::StageType,std::allocator<glcts::StageType>>::
  vector<glcts::StageType_const*,void>
            ((vector<glcts::StageType,std::allocator<glcts::StageType>> *)&stages,
             (StageType *)stageTypes,(StageType *)test_args,(allocator_type *)&testName);
  this_00 = test_args;
  std::vector<glcts::LayoutBindingParameters,std::allocator<glcts::LayoutBindingParameters>>::
  vector<glcts::LayoutBindingParameters_const*,void>
            ((vector<glcts::LayoutBindingParameters,std::allocator<glcts::LayoutBindingParameters>>
              *)&samplers,(LayoutBindingParameters *)test_args,
             (LayoutBindingParameters *)LayoutBindingBaseCase::makeSparseRange::rangeT,
             (allocator_type *)&testName);
  pSVar13 = stages.super__Vector_base<glcts::StageType,_std::allocator<glcts::StageType>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (stages.super__Vector_base<glcts::StageType,_std::allocator<glcts::StageType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      stages.super__Vector_base<glcts::StageType,_std::allocator<glcts::StageType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pLVar14 = samplers.
              super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    stageType = stages.super__Vector_base<glcts::StageType,_std::allocator<glcts::StageType>_>.
                _M_impl.super__Vector_impl_data._M_start;
    do {
      testArgs = samplers.
                 super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (samplers.
          super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
          ._M_impl.super__Vector_impl_data._M_start != pLVar14) {
        do {
          createTestName_abi_cxx11_(&testName,(LayoutBindingTests *)this_00,stageType,testArgs);
          switch(testArgs->surface_type) {
          case AtomicCounter:
            this_00 = (undefined1 *)operator_new(0x228);
            uVar1 = stageType->name;
            uVar2 = stageType->type;
            stage.type = uVar2;
            stage.name = (char *)uVar1;
            stage._12_4_ = 0;
            LayoutBindingBaseCase::LayoutBindingBaseCase
                      ((LayoutBindingBaseCase *)this_00,(this->super_TestCaseGroup).m_context,
                       testName._M_dataplus._M_p,"test atomic counters layout binding functionality"
                       ,stage,testArgs,this->m_glslVersion);
            (((LayoutBindingBaseCase *)this_00)->super_TestCase).super_TestCase.super_TestNode.
            _vptr_TestNode = (_func_int **)&PTR__SamplerLayoutBindingCase_020fd890;
            ppuVar12 = &PTR__AtomicCounterLayoutBindingCase_020fd9f0;
            break;
          case Texture:
            this_00 = (undefined1 *)operator_new(0x228);
            uVar9 = stageType->name;
            uVar10 = stageType->type;
            stage_03.type = uVar10;
            stage_03.name = (char *)uVar9;
            stage_03._12_4_ = 0;
            LayoutBindingBaseCase::LayoutBindingBaseCase
                      ((LayoutBindingBaseCase *)this_00,(this->super_TestCaseGroup).m_context,
                       testName._M_dataplus._M_p,"test sampler layout binding functionality",
                       stage_03,testArgs,this->m_glslVersion);
            (((LayoutBindingBaseCase *)this_00)->super_TestCase).super_TestCase.super_TestNode.
            _vptr_TestNode = (_func_int **)&PTR__SamplerLayoutBindingCase_020fcf40;
            ppuVar12 = &PTR__SamplerLayoutBindingCase_020fd0a0;
            break;
          case Image:
            this_00 = (undefined1 *)operator_new(0x228);
            uVar5 = stageType->name;
            uVar6 = stageType->type;
            stage_01.type = uVar6;
            stage_01.name = (char *)uVar5;
            stage_01._12_4_ = 0;
            LayoutBindingBaseCase::LayoutBindingBaseCase
                      ((LayoutBindingBaseCase *)this_00,(this->super_TestCaseGroup).m_context,
                       testName._M_dataplus._M_p,"test image layout binding functionality",stage_01,
                       testArgs,this->m_glslVersion);
            (((LayoutBindingBaseCase *)this_00)->super_TestCase).super_TestCase.super_TestNode.
            _vptr_TestNode = (_func_int **)&PTR__SamplerLayoutBindingCase_020fd0e8;
            ppuVar12 = &PTR__ImageLayoutBindingCase_020fd248;
            break;
          case UniformBlock:
            this_00 = (undefined1 *)operator_new(0x228);
            uVar7 = stageType->name;
            uVar8 = stageType->type;
            stage_02.type = uVar8;
            stage_02.name = (char *)uVar7;
            stage_02._12_4_ = 0;
            LayoutBindingBaseCase::LayoutBindingBaseCase
                      ((LayoutBindingBaseCase *)this_00,(this->super_TestCaseGroup).m_context,
                       testName._M_dataplus._M_p,"test uniform block layout binding functionality",
                       stage_02,testArgs,this->m_glslVersion);
            (((LayoutBindingBaseCase *)this_00)->super_TestCase).super_TestCase.super_TestNode.
            _vptr_TestNode = (_func_int **)&PTR__SamplerLayoutBindingCase_020fd290;
            ppuVar12 = &PTR__UniformBlocksLayoutBindingCase_020fd3f0;
            goto LAB_00bd4579;
          case ShaderStorageBuffer:
            this_00 = (undefined1 *)operator_new(0x228);
            uVar3 = stageType->name;
            uVar4 = stageType->type;
            stage_00.type = uVar4;
            stage_00.name = (char *)uVar3;
            stage_00._12_4_ = 0;
            LayoutBindingBaseCase::LayoutBindingBaseCase
                      ((LayoutBindingBaseCase *)this_00,(this->super_TestCaseGroup).m_context,
                       testName._M_dataplus._M_p,
                       "test shader storage buffer layout binding functionality",stage_00,testArgs,
                       this->m_glslVersion);
            (((LayoutBindingBaseCase *)this_00)->super_TestCase).super_TestCase.super_TestNode.
            _vptr_TestNode = (_func_int **)&PTR__SamplerLayoutBindingCase_020fd438;
            ppuVar12 = &PTR__ShaderStorageBufferLayoutBindingCase_020fd598;
LAB_00bd4579:
            (((LayoutBindingBaseCase *)this_00)->super_IProgramContextSupplier).
            _vptr_IProgramContextSupplier = (_func_int **)ppuVar12;
            *(undefined4 *)&((LayoutBindingBaseCase *)this_00)->field_0x224 = 0;
            goto LAB_00bd45d8;
          default:
            goto switchD_00bd444c_default;
          }
          (((LayoutBindingBaseCase *)this_00)->super_IProgramContextSupplier).
          _vptr_IProgramContextSupplier = (_func_int **)ppuVar12;
LAB_00bd45d8:
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
switchD_00bd444c_default:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)testName._M_dataplus._M_p != &testName.field_2) {
            this_00 = (undefined1 *)(testName.field_2._M_allocated_capacity + 1);
            operator_delete(testName._M_dataplus._M_p,(ulong)this_00);
          }
          pLVar14 = testArgs + 1;
          pSVar13 = stages.super__Vector_base<glcts::StageType,_std::allocator<glcts::StageType>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          testArgs = pLVar14;
        } while (pLVar14 !=
                 samplers.
                 super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      stageType = stageType + 1;
    } while (stageType != pSVar13);
  }
  iVar11 = (int)pSVar13;
  if (samplers.
      super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(samplers.
                    super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)samplers.
                          super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)samplers.
                          super__Vector_base<glcts::LayoutBindingParameters,_std::allocator<glcts::LayoutBindingParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar11 = extraout_EAX;
  }
  if (stages.super__Vector_base<glcts::StageType,_std::allocator<glcts::StageType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(stages.super__Vector_base<glcts::StageType,_std::allocator<glcts::StageType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)stages.
                          super__Vector_base<glcts::StageType,_std::allocator<glcts::StageType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)stages.
                          super__Vector_base<glcts::StageType,_std::allocator<glcts::StageType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    iVar11 = extraout_EAX_00;
  }
  return iVar11;
}

Assistant:

void LayoutBindingTests::init(void)
{
	std::vector<StageType>				 stages   = makeVector(stageTypes);
	std::vector<LayoutBindingParameters> samplers = makeVector(test_args);
	for (std::vector<StageType>::iterator stagesIter = stages.begin(); stagesIter != stages.end(); stagesIter++)
	{
		for (std::vector<LayoutBindingParameters>::iterator testArgsIter = samplers.begin();
			 testArgsIter != samplers.end(); testArgsIter++)
		{
			String testName = createTestName(*stagesIter, *testArgsIter);
			switch ((*testArgsIter).surface_type)
			{
			case Texture:
				addChild(new SamplerLayoutBindingCase(m_context, testName.c_str(),
													  "test sampler layout binding functionality", *stagesIter,
													  *testArgsIter, m_glslVersion));
				break;
			case Image:
				addChild(new ImageLayoutBindingCase(m_context, testName.c_str(),
													"test image layout binding functionality", *stagesIter,
													*testArgsIter, m_glslVersion));
				break;
			case AtomicCounter:
				addChild(new AtomicCounterLayoutBindingCase(m_context, testName.c_str(),
															"test atomic counters layout binding functionality",
															*stagesIter, *testArgsIter, m_glslVersion));
				break;
			case UniformBlock:
				addChild(new UniformBlocksLayoutBindingCase(m_context, testName.c_str(),
															"test uniform block layout binding functionality",
															*stagesIter, *testArgsIter, m_glslVersion));
				break;
			case ShaderStorageBuffer:
				addChild(new ShaderStorageBufferLayoutBindingCase(
					m_context, testName.c_str(), "test shader storage buffer layout binding functionality", *stagesIter,
					*testArgsIter, m_glslVersion));
				break;
			default:
				DE_ASSERT(0);
				break;
			}
		}
	}
}